

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.h
# Opt level: O0

void __thiscall slang::parsing::ParserMetadata::ParserMetadata(ParserMetadata *this)

{
  ParserMetadata *this_local;
  
  ska::
  flat_hash_map<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>
  ::flat_hash_map(&this->nodeMap);
  ska::
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::flat_hash_set(&this->globalInstances);
  std::
  vector<const_slang::syntax::IdentifierNameSyntax_*,_std::allocator<const_slang::syntax::IdentifierNameSyntax_*>_>
  ::vector(&this->classPackageNames);
  std::
  vector<const_slang::syntax::PackageImportDeclarationSyntax_*,_std::allocator<const_slang::syntax::PackageImportDeclarationSyntax_*>_>
  ::vector(&this->packageImports);
  std::
  vector<const_slang::syntax::DefParamSyntax_*,_std::allocator<const_slang::syntax::DefParamSyntax_*>_>
  ::vector(&this->defparams);
  std::
  vector<const_slang::syntax::ClassDeclarationSyntax_*,_std::allocator<const_slang::syntax::ClassDeclarationSyntax_*>_>
  ::vector(&this->classDecls);
  std::
  vector<const_slang::syntax::BindDirectiveSyntax_*,_std::allocator<const_slang::syntax::BindDirectiveSyntax_*>_>
  ::vector(&this->bindDirectives);
  Token::Token(&this->eofToken);
  return;
}

Assistant:

struct SLANG_EXPORT ParserMetadata {
    /// Collection of metadata that can be associated with a syntax node at parse time.
    struct Node {
        TokenKind defaultNetType;
        TokenKind unconnectedDrive;
        std::optional<TimeScale> timeScale;
    };

    /// Specific metadata that was in effect when certain syntax nodes were parsed
    /// (such as various bits of preprocessor state).
    flat_hash_map<const syntax::SyntaxNode*, Node> nodeMap;

    /// A set of names of all instantiations of global modules/interfaces/programs.
    /// This can be used to determine which modules should be considered as top-level
    /// roots of the design.
    flat_hash_set<string_view> globalInstances;

    /// A list of all names parsed that could represent a package or class name,
    /// since they are simple names that appear on the left-hand side of a double colon.
    std::vector<const syntax::IdentifierNameSyntax*> classPackageNames;

    /// A list of all package import declarations parsed.
    std::vector<const syntax::PackageImportDeclarationSyntax*> packageImports;

    /// A list of all defparams parsed.
    std::vector<const syntax::DefParamSyntax*> defparams;

    /// A list of all class declarations parsed.
    std::vector<const syntax::ClassDeclarationSyntax*> classDecls;

    /// A list of all bind directives parsed.
    std::vector<const syntax::BindDirectiveSyntax*> bindDirectives;

    /// The EOF token, if one has already been consumed by the parser.
    /// Otherwise an empty token.
    Token eofToken;

    /// Constructs a new set of parser metadata by walking the provided syntax tree.
    static ParserMetadata fromSyntax(const syntax::SyntaxNode& root);
}